

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
* phmap::priv::
  btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
  ::init_leaf(btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
              *n,btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
                 *parent,int max_cnt)

{
  slot_type *m;
  int max_cnt_local;
  btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
  *parent_local;
  btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
  *n_local;
  
  set_parent(n,parent);
  set_position(n,'\0');
  set_start(n,'\0');
  set_count(n,'\0');
  set_max_count(n,(field_type)max_cnt);
  m = slot(n,0);
  SanitizerPoisonMemoryRegion(m,(long)max_cnt << 2);
  return n;
}

Assistant:

static btree_node *init_leaf(btree_node *n, btree_node *parent,
                                     int max_cnt) {
            n->set_parent(parent);
            n->set_position(0);
            n->set_start(0);
            n->set_count(0);
            n->set_max_count((field_type)max_cnt);
            phmap::priv::SanitizerPoisonMemoryRegion(
                n->slot(0), max_cnt * sizeof(slot_type));
            return n;
        }